

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTokenizer.cpp
# Opt level: O2

int __thiscall OpenMD::StringTokenizer::countTokens(StringTokenizer *this)

{
  bool bVar1;
  uint uVar2;
  char *pcVar3;
  int iVar4;
  char *pcVar5;
  
  pcVar5 = (this->currentPos_)._M_current;
  iVar4 = 0;
  do {
    pcVar3 = pcVar5;
    if (pcVar5 == (this->end_)._M_current) {
LAB_001f1cb8:
      if (pcVar5 == pcVar3) {
        return iVar4;
      }
      for (; pcVar5 != pcVar3; pcVar5 = pcVar5 + 1) {
        bVar1 = isDelimiter(this,*pcVar5);
        if (bVar1) break;
        pcVar3 = (this->end_)._M_current;
      }
      uVar2 = 1;
    }
    else {
      bVar1 = isDelimiter(this,*pcVar5);
      if (!bVar1) {
        pcVar3 = (this->end_)._M_current;
        goto LAB_001f1cb8;
      }
      pcVar5 = pcVar5 + 1;
      uVar2 = (uint)this->returnTokens_;
    }
    iVar4 = iVar4 + uVar2;
  } while( true );
}

Assistant:

int StringTokenizer::countTokens() {
    std::string::const_iterator tmpIter = currentPos_;
    int numToken                        = 0;

    while (true) {
      // skip delimiter first
      while (tmpIter != end_ && isDelimiter(*tmpIter)) {
        ++tmpIter;

        if (returnTokens_) {
          // if delimiter is consider as token
          ++numToken;
        }
      }

      if (tmpIter == end_) { break; }

      // encount a token here
      while (tmpIter != end_ && !isDelimiter(*tmpIter)) {
        ++tmpIter;
      }

      ++numToken;
    }

    return numToken;
  }